

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_invalid_key_exception.cpp
# Opt level: O3

void __thiscall
argo::json_invalid_key_exception::json_invalid_key_exception
          (json_invalid_key_exception *this,exception_type et,string *key)

{
  char *__dest;
  char *__src;
  
  json_exception::json_exception(&this->super_json_exception,et);
  *(undefined ***)&this->super_json_exception = &PTR__exception_00128c78;
  __dest = (this->super_json_exception).m_message;
  if (et == invalid_key_e) {
    strncpy(__dest,"invalid object key: ",200);
    __src = (key->_M_dataplus)._M_p;
  }
  else {
    __src = "generic";
  }
  strncpy(__dest,__src,200);
  return;
}

Assistant:

json_invalid_key_exception::json_invalid_key_exception(exception_type et, const string &key) noexcept : json_exception(et)
{
    if (et == invalid_key_e)
    {
        strncpy(m_message, "invalid object key: ", max_message_length);
        strncpy(m_message, key.c_str(), max_message_length);
    }
    else
    {
        strncpy(m_message, "generic", max_message_length);
    }
}